

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.cc
# Opt level: O0

void drawFaces(Mat *img,vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *faces)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Point PVar4;
  Point PVar5;
  reference pvVar6;
  _InputArray local_e8;
  allocator<char> local_c9;
  string local_c8 [32];
  Scalar_<double> local_a8;
  Size_<int> local_88;
  Point_<int> local_80;
  _InputOutputArray local_78;
  Point_<int> local_60;
  Point center;
  size_t i;
  allocator<char> local_39;
  string local_38 [32];
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *local_18;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *faces_local;
  Mat *img_local;
  
  local_18 = faces;
  faces_local = (vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)img;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"draw faces",&local_39);
  cv::namedWindow(local_38,1);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  center.x = 0;
  center.y = 0;
  while( true ) {
    PVar4 = center;
    PVar5 = (Point)std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::size(faces);
    if ((ulong)PVar5 <= (ulong)PVar4) break;
    pvVar6 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                       (faces,(size_type)center);
    iVar1 = pvVar6->x;
    pvVar6 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                       (faces,(size_type)center);
    iVar2 = pvVar6->width;
    pvVar6 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                       (faces,(size_type)center);
    iVar3 = pvVar6->y;
    pvVar6 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                       (faces,(size_type)center);
    cv::Point_<int>::Point_(&local_60,iVar1 + iVar2 / 2,iVar3 + pvVar6->height / 2);
    cv::_InputOutputArray::_InputOutputArray(&local_78,img);
    cv::Point_<int>::Point_(&local_80,&local_60);
    pvVar6 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                       (faces,(size_type)center);
    iVar1 = pvVar6->width;
    pvVar6 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                       (faces,(size_type)center);
    cv::Size_<int>::Size_(&local_88,iVar1 / 2,(int)((double)pvVar6->height / 1.5));
    cv::Scalar_<double>::Scalar_(&local_a8,0.0,255.0,0.0,0.0);
    cv::ellipse(0,0,0x4076800000000000,&local_78,&local_80,&local_88,&local_a8,2,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_78);
    center = (Point)((long)center + 1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"draw faces",&local_c9);
  cv::_InputArray::_InputArray(&local_e8,img);
  cv::imshow(local_c8,&local_e8);
  cv::_InputArray::~_InputArray(&local_e8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  return;
}

Assistant:

void drawFaces(Mat img, vector<Rect> faces) {
  namedWindow("draw faces");
  for (size_t i = 0; i < faces.size(); i++) {
    // 先确定人脸矩形中心坐标,再根据该坐标画椭圆
    Point center(faces[i].x + faces[i].width / 2,
                 faces[i].y + faces[i].height / 2);
    ellipse(img, center, Size(faces[i].width / 2, faces[i].height / 1.5), 0, 0,
            360, Scalar(0, 255, 0), 2, 8, 0);
  }
  imshow("draw faces", img);
}